

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

void __thiscall Population::printChromos(Population *this)

{
  bool bVar1;
  reference pCVar2;
  ostream *poVar3;
  size_type sVar4;
  void *this_00;
  undefined1 local_88 [8];
  Chromosome chromo;
  iterator __end1;
  iterator __begin1;
  vector<Chromosome,_std::allocator<Chromosome>_> *__range1;
  Population *this_local;
  
  __end1 = std::vector<Chromosome,_std::allocator<Chromosome>_>::begin(&this->chromosomes);
  chromo.pathList.super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<Chromosome,_std::allocator<Chromosome>_>::end(&this->chromosomes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
                                *)&chromo.pathList.
                                   super__Vector_base<Coordinate,_std::allocator<Coordinate>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
             ::operator*(&__end1);
    Chromosome::Chromosome((Chromosome *)local_88,pCVar2);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,local_88._0_4_);
    std::operator<<(poVar3,": ");
    Chromosome::printTurns((Chromosome *)local_88);
    Chromosome::~Chromosome((Chromosome *)local_88);
    __gnu_cxx::
    __normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>::
    operator++(&__end1);
  }
  sVar4 = std::vector<Chromosome,_std::allocator<Chromosome>_>::size(&this->chromosomes);
  this_00 = (void *)std::ostream::operator<<(&std::cout,sVar4);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Population::printChromos() {


    for (auto chromo : chromosomes){
        std::cout << chromo.id << ": ";
        chromo.printTurns();
    }
    std::cout << chromosomes.size()<< std::endl;
}